

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

Array * __thiscall
czh::parser::Parser::parse_array_abi_cxx11_(Array *__return_storage_ptr__,Parser *this)

{
  Token *this_00;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:153:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:154:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:155:13)>
  local_88;
  Token local_80;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  get(&local_80,this);
  this_00 = &this->curr_tok;
  token::Token::operator=(this_00,&local_80);
  token::Token::~Token(&local_80);
  do {
    if (this_00->type != COMMA) {
      if (this_00->type == ARR_RP) {
        get(&local_80,this);
        token::Token::operator=(this_00,&local_80);
        token::Token::~Token(&local_80);
        return __return_storage_ptr__;
      }
      local_88.super_anon_class_8_1_ba1d7401.ret =
           (anon_class_8_1_ba1d7401)(anon_class_8_1_ba1d7401)__return_storage_ptr__;
      std::__detail::__variant::
      _Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_80,
                        (_Copy_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&(this->curr_tok).what);
      std::
      visit<czh::utils::overloaded<czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(auto:1&&)_1_,czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(czh::value::Reference)_1_,czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>)_1_>,std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string,czh::value::Reference,std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>>
                (&local_88,
                 (variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_80);
      std::__detail::__variant::
      _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&local_80);
    }
    get(&local_80,this);
    token::Token::operator=(this_00,&local_80);
    token::Token::~Token(&local_80);
  } while( true );
}

Assistant:

value::Array parse_array()
    {
      value::Array ret;
      curr_tok = get();//eat [
      for (; curr_tok.type != token::TokenType::ARR_RP; curr_tok = get())
      {
        if (curr_tok.type == token::TokenType::COMMA) continue;
        std::visit(utils::overloaded{
            [&ret](auto &&a) { ret.insert(ret.end(), a); },
            [](value::Reference) { error::czh_unreachable(); },
            [](value::Array) { error::czh_unreachable(); }
        }, curr_tok.what.get_variant());
      }
      curr_tok = get();//eat ]
      return ret;
    }